

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mpiabi_defn_functions_c.h
# Opt level: O1

int MPIABI_Comm_accept(char *port_name,MPIABI_Info info,int root,MPIABI_Comm comm,
                      MPIABI_Comm *newcomm)

{
  int iVar1;
  
  iVar1 = MPI_Comm_accept();
  return iVar1;
}

Assistant:

int MPIABI_Comm_accept(
  const char * port_name,
  MPIABI_Info info,
  int root,
  MPIABI_Comm comm,
  MPIABI_Comm * newcomm
) {
  return MPI_Comm_accept(
    port_name,
    (MPI_Info)(WPI_Info)info,
    root,
    (MPI_Comm)(WPI_Comm)comm,
    (MPI_Comm *)(WPI_CommPtr)newcomm
  );
}